

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainClient.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Client *this;
  Client **local_78;
  thread local_70;
  thread thr_recv;
  thread local_60;
  thread thr_send;
  allocator<char> local_41;
  string local_40;
  Client *local_20;
  Client *client;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  client = (Client *)argv;
  argv_local._0_4_ = argc;
  this = (Client *)operator_new(0x90);
  thr_send._M_id._M_thread._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"127.0.0.1",&local_41);
  Client::Client(this,&local_40,0x15c8);
  thr_send._M_id._M_thread._3_1_ = 0;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = this;
  (**(this->super_TCP)._vptr_TCP)();
  thr_recv._M_id._M_thread = (id)(id)&local_20;
  std::thread::thread<void(&)(Client**),Client**,void>
            (&local_60,SendMsgHandler,(Client ***)&thr_recv);
  local_78 = &local_20;
  std::thread::thread<void(&)(Client**),Client**,void>(&local_70,ReceiveMsgHandler,&local_78);
  std::thread::join();
  std::thread::join();
  (*(local_20->super_TCP)._vptr_TCP[3])();
  argv_local._4_4_ = 0;
  std::thread::~thread(&local_70);
  std::thread::~thread(&local_60);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    Client *client = new Client("127.0.0.1", 5576);
    client->Connect();

    std::thread thr_send = std::thread(SendMsgHandler, &client);
    std::thread thr_recv = std::thread(ReceiveMsgHandler, &client);

    thr_send.join();
    thr_recv.join();

    client->Close();

    return 0;
}